

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiPopupData *pIVar7;
  ImGuiContext *pIVar8;
  ImVec2 *pIVar9;
  ImGuiPopupData *pIVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ImGuiContext *g;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  iVar12 = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) == 0) || ((GImGui->OpenPopupStack).Size <= iVar12)) {
    local_38.x = 0.0;
    local_38.y = 0.0;
    pIVar5 = GImGui->NavWindow;
    iVar2 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
    local_38 = NavCalcPreferredRefPos();
    pIVar9 = &(pIVar8->IO).MousePos;
    if ((pIVar8->IO).MousePos.y < -256000.0 || (pIVar8->IO).MousePos.x < -256000.0) {
      pIVar9 = &local_38;
    }
    IVar6 = *pIVar9;
    if ((pIVar8->DebugLogFlags & 4) != 0) {
      DebugLog("[popup] OpenPopupEx(0x%08X)\n");
    }
    iVar4 = (pIVar8->OpenPopupStack).Size;
    if (iVar12 < iVar4) {
      pIVar7 = (pIVar8->OpenPopupStack).Data;
      if ((pIVar7[iVar12].PopupId == id) &&
         (pIVar7[iVar12].OpenFrameCount == pIVar8->FrameCount + -1)) {
        pIVar7[iVar12].OpenFrameCount = iVar2;
        return;
      }
      ClosePopupToLevel(iVar12,false);
      iVar12 = (pIVar8->OpenPopupStack).Size;
      iVar4 = (pIVar8->OpenPopupStack).Capacity;
      if (iVar12 == iVar4) {
        iVar12 = iVar12 + 1;
        if (iVar4 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar4 / 2 + iVar4;
        }
        if (iVar12 < iVar11) {
          iVar12 = iVar11;
        }
        if (iVar4 < iVar12) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar10 = (ImGuiPopupData *)
                    (*GImAllocatorAllocFunc)((long)iVar12 * 0x38,GImAllocatorUserData);
          pIVar7 = (pIVar8->OpenPopupStack).Data;
          if (pIVar7 != (ImGuiPopupData *)0x0) {
            memcpy(pIVar10,pIVar7,(long)(pIVar8->OpenPopupStack).Size * 0x38);
            pIVar7 = (pIVar8->OpenPopupStack).Data;
            if ((pIVar7 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
          }
          (pIVar8->OpenPopupStack).Data = pIVar10;
          (pIVar8->OpenPopupStack).Capacity = iVar12;
        }
      }
      pIVar7 = (pIVar8->OpenPopupStack).Data;
      iVar12 = (pIVar8->OpenPopupStack).Size;
      pIVar7[iVar12].PopupId = id;
      *(undefined4 *)&pIVar7[iVar12].field_0x4 = 0;
      pIVar7[iVar12].Window = (ImGuiWindow *)0x0;
      pIVar7[iVar12].BackupNavWindow = pIVar5;
      pIVar7[iVar12].ParentNavLayer = -1;
      pIVar7[iVar12].OpenFrameCount = iVar2;
      pIVar7[iVar12].OpenParentId = uVar3;
      pIVar7[iVar12].OpenPopupPos = local_38;
      pIVar7[iVar12].OpenMousePos = IVar6;
      *(undefined4 *)&pIVar7[iVar12].field_0x34 = 0;
    }
    else {
      iVar12 = (pIVar8->OpenPopupStack).Capacity;
      if (iVar4 == iVar12) {
        if (iVar12 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar12 / 2 + iVar12;
        }
        iVar13 = iVar4 + 1;
        if (iVar4 + 1 < iVar11) {
          iVar13 = iVar11;
        }
        if (iVar12 < iVar13) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar10 = (ImGuiPopupData *)
                    (*GImAllocatorAllocFunc)((long)iVar13 * 0x38,GImAllocatorUserData);
          pIVar7 = (pIVar8->OpenPopupStack).Data;
          if (pIVar7 != (ImGuiPopupData *)0x0) {
            memcpy(pIVar10,pIVar7,(long)(pIVar8->OpenPopupStack).Size * 0x38);
            pIVar7 = (pIVar8->OpenPopupStack).Data;
            if ((pIVar7 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
          }
          (pIVar8->OpenPopupStack).Data = pIVar10;
          (pIVar8->OpenPopupStack).Capacity = iVar13;
        }
      }
      pIVar7 = (pIVar8->OpenPopupStack).Data;
      iVar12 = (pIVar8->OpenPopupStack).Size;
      pIVar7[iVar12].PopupId = id;
      *(undefined4 *)&pIVar7[iVar12].field_0x4 = 0;
      pIVar7[iVar12].Window = (ImGuiWindow *)0x0;
      pIVar7[iVar12].BackupNavWindow = pIVar5;
      pIVar7[iVar12].ParentNavLayer = -1;
      pIVar7[iVar12].OpenFrameCount = iVar2;
      pIVar7[iVar12].OpenParentId = uVar3;
      pIVar7[iVar12].OpenPopupPos = local_38;
      pIVar7[iVar12].OpenMousePos = IVar6;
      *(undefined4 *)&pIVar7[iVar12].field_0x34 = 0;
    }
    (pIVar8->OpenPopupStack).Size = (pIVar8->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.BackupNavWindow = g.NavWindow;            // When popup closes focus may be restored to NavWindow (depend on window type).
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("[popup] OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}